

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::CheckResume(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  char cVar2;
  int index;
  long *plVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type *psVar6;
  string fname;
  string line;
  ifstream fin;
  string local_270;
  char *local_250;
  undefined8 local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined1 local_230 [520];
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)local_230,this->CTest);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_230);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_270.field_2._M_allocated_capacity = *psVar6;
    local_270.field_2._8_8_ = plVar3[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar6;
    local_270._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_270._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  bVar1 = cmCTest::GetFailover(this->CTest);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileExists(&local_270,true);
    if (bVar1) {
      poVar4 = this->TestHandler->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Resuming previously interrupted test set",0x28);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"----------------------------------------------------------",0x3a);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::ifstream::ifstream(local_230);
      std::ifstream::open((char *)local_230,(_Ios_Openmode)local_270._M_dataplus._M_p);
      local_248 = 0;
      local_240 = '\0';
      local_250 = &local_240;
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) +
                                (char)(istream *)local_230);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_230,(string *)&local_250,cVar2);
        if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0) break;
        index = atoi(local_250);
        RemoveTest(this,index);
      }
      std::ifstream::close();
      if (local_250 != &local_240) {
        operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
      }
      std::ifstream::~ifstream(local_230);
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&local_270,true);
    if (bVar1) {
      cmsys::SystemTools::RemoveFile(&local_270);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResume()
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  if (this->CTest->GetFailover()) {
    if (cmSystemTools::FileExists(fname, true)) {
      *this->TestHandler->LogFile
        << "Resuming previously interrupted test set" << std::endl
        << "----------------------------------------------------------"
        << std::endl;

      cmsys::ifstream fin;
      fin.open(fname.c_str());
      std::string line;
      while (std::getline(fin, line)) {
        int index = atoi(line.c_str());
        this->RemoveTest(index);
      }
      fin.close();
    }
  } else if (cmSystemTools::FileExists(fname, true)) {
    cmSystemTools::RemoveFile(fname);
  }
}